

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O1

void __thiscall UnitTest::UnitTester::runTestInt(UnitTester *this,TestFunction fun,char *name)

{
  int iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  char *__s;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((_DAT_00106190 != (char *)0x0) && (iVar1 = strcmp(name,_DAT_00106190), iVar1 != 0)) {
    return;
  }
  _global_unit_test_object_ = 1;
  _DAT_00106184 = 0x3f800000;
  _DAT_00106188 = 0x3ff0000000000000;
  (*fun)();
  if (DAT_00106179 == '\x01') {
    if (global_unit_test_object_ == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"XFAIL: ",7);
      if (name == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
      }
      else {
        sVar2 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"unexpected PASS: ",0x11);
    if (name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\n    This test should have failed but didn\'t. Check the code!",0x3d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    if (global_unit_test_object_ != '\0') {
      operator<<((ostream *)&std::cout,(Type *)&AnsiColor::green);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," PASS: ",7);
      operator<<((ostream *)&std::cout,(Type *)&AnsiColor::normal);
      if (name == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
      }
      else {
        sVar2 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      this->passedTests = this->passedTests + 1;
      return;
    }
    __s = _unittest_fail();
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
    }
    if (this->vim_lines == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_3cfd,4);
    }
    if (name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    if (this->vim_lines == true) {
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
    }
  }
  this->failedTests = this->failedTests + 1;
  return;
}

Assistant:

void UnitTester::runTestInt(TestFunction fun, const char *name) {  // {{{1
  if (global_unit_test_object_.only_name &&
      0 != std::strcmp(name, global_unit_test_object_.only_name)) {
    return;
  }
  global_unit_test_object_.status = true;
  global_unit_test_object_.expect_failure = false;
  try {
    setFuzzyness<float>(1);
    setFuzzyness<double>(1);
    fun();
  }
  catch (UnitTestFailure) {
  }
  catch (std::exception &e) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception:\n";
    std::cout << _unittest_fail() << "│ " << e.what() << '\n';
    global_unit_test_object_.status = false;
  }
  catch (...) {
    std::cout << _unittest_fail() << "┍ " << name
              << " threw an unexpected exception, of unknown type\n";
    global_unit_test_object_.status = false;
  }
  if (global_unit_test_object_.expect_failure) {
    if (!global_unit_test_object_.status) {
      std::cout << "XFAIL: " << name << std::endl;
    } else {
      std::cout
          << "unexpected PASS: " << name
          << "\n    This test should have failed but didn't. Check the code!"
          << std::endl;
      ++failedTests;
    }
  } else {
    if (!global_unit_test_object_.status) {
      std::cout << _unittest_fail();
      if (!vim_lines) {
        std::cout << "┕ ";
      }
      std::cout << name << std::endl;
      if (vim_lines) {
        std::cout << '\n';
      }
      ++failedTests;
    } else {
      UnitTest::printPass();
      std::cout << name;
      std::cout << std::endl;
      ++passedTests;
    }
  }
}